

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PelcoD.cpp
# Opt level: O0

void __thiscall
PelcoD::moveTopOnce(PelcoD *this,int panSpeed,int tiltSpeed,
                   vector<char,_std::allocator<char>_> *mess)

{
  int iVar1;
  reference pvVar2;
  allocator_type local_39;
  vector<char,_std::allocator<char>_> local_38;
  vector<char,_std::allocator<char>_> *local_20;
  vector<char,_std::allocator<char>_> *mess_local;
  int tiltSpeed_local;
  int panSpeed_local;
  PelcoD *this_local;
  
  local_20 = mess;
  mess_local._0_4_ = tiltSpeed;
  mess_local._4_4_ = panSpeed;
  _tiltSpeed_local = this;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(&local_38,9,&local_39);
  std::vector<char,_std::allocator<char>_>::operator=(local_20,&local_38);
  std::vector<char,_std::allocator<char>_>::~vector(&local_38);
  std::allocator<char>::~allocator(&local_39);
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](local_20,0);
  *pvVar2 = -0x7f;
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](local_20,1);
  *pvVar2 = '\x01';
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](local_20,2);
  *pvVar2 = '\x06';
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](local_20,3);
  *pvVar2 = '\x01';
  iVar1 = mess_local._4_4_ % 0xff;
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](local_20,4);
  *pvVar2 = (value_type)iVar1;
  iVar1 = (int)mess_local % 0xff;
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](local_20,5);
  *pvVar2 = (value_type)iVar1;
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](local_20,6);
  *pvVar2 = '\x03';
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](local_20,7);
  *pvVar2 = '\x01';
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](local_20,8);
  *pvVar2 = -1;
  return;
}

Assistant:

void PelcoD::moveTopOnce(int panSpeed, int tiltSpeed, std::vector<char> &mess)
{
	mess = std::vector<char>(9);
	mess[0] = 0x81;
	mess[1] = 0x01;
	mess[2] = 0x06;
	mess[3] = 0x01;
	mess[4] = panSpeed % 255;
	mess[5] = tiltSpeed % 255;
	mess[6] = 0x03;
	mess[7] = 0x01;
	mess[8] = 0xff;
}